

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

void __thiscall EPoller::removeChannel(EPoller *this,ChannelPtr *channel)

{
  ChannelMap *this_00;
  uint __line;
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  char *__assertion;
  Logger local_1010;
  epoll_event local_38;
  int fd;
  
  local_38.data.u64._4_4_ =
       ((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->fd_;
  this_00 = &this->channels_;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)((long)&local_38.data + 4));
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>._M_cur
      == (__node_type *)0x0) {
    __assertion = "channels_.find(fd) != channels_.end()";
    __line = 0x53;
  }
  else {
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)((long)&local_38.data + 4));
    if ((pmVar3->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
      std::
      _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&this_00->_M_h,(undefined1 *)((long)&local_38.data + 4));
      local_38.data.fd = 0;
      local_38.events =
           ((channel->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->events_;
      local_38._4_4_ = local_38.data.u64._4_4_;
      iVar1 = epoll_ctl(this->epollfd_,2,local_38.data.u64._4_4_,&local_38);
      if (iVar1 < 0) {
        Logger::Logger(&local_1010,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                       ,0x5c);
        LogStream::operator<<((LogStream *)&local_1010,"Error: epoll_del error");
        Logger::~Logger(&local_1010);
      }
      return;
    }
    __assertion = "channels_[fd] == channel";
    __line = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                ,__line,"void EPoller::removeChannel(ChannelPtr)");
}

Assistant:

void EPoller::removeChannel(ChannelPtr channel) {
    int fd = channel->fd();
    assert(channels_.find(fd) != channels_.end());
    assert(channels_[fd] == channel);

    channels_.erase(fd);
    struct epoll_event event;
    memset(&event, 0, sizeof event);
    event.events = channel->events();
    event.data.fd = fd;
    if (epoll_ctl(epollfd_, EPOLL_CTL_DEL, fd, &event) < 0) {
        LOG << "Error: epoll_del error";
    } 
    // LOG << "Epoll DEL fd = " << fd;
}